

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Selector>::moveAppend
          (QGenericArrayOps<QCss::Selector> *this,Selector *b,Selector *e)

{
  Selector *this_00;
  ulong in_RDX;
  ulong in_RSI;
  Selector *in_RDI;
  Selector *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QCss::Selector>::begin
                        ((QArrayDataPointer<QCss::Selector> *)0xa49457);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QCss::Selector::Selector(this_00,in_RDI);
      local_10 = local_10 + 0x18;
      (in_RDI->basicSelectors).d.size = (in_RDI->basicSelectors).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }